

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PowerDifferentiationTest.cpp
# Opt level: O2

int main(int param_1,char **param_2)

{
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  Variable x;
  int local_fc;
  double local_f8;
  string local_e0;
  Variable local_c0;
  BinaryExpression local_a8;
  Expression local_80;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  string local_28;
  
  Kandinsky::Variable::Variable(&local_c0);
  (local_c0.m_variableExpressionPtr.
   super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_value =
       3.0;
  local_80._vptr_Expression._0_4_ = 5;
  Kandinsky::pow<Kandinsky::Variable,_int,_nullptr>
            ((PowerExpression *)&local_a8,&local_c0,(int *)&local_80);
  Kandinsky::BaseExpression::differentiate
            ((Expression *)&local_e0,&local_a8.super_BaseExpression,&local_c0);
  (*(code *)**(undefined8 **)local_e0._M_string_length)();
  local_f8 = extraout_XMM0_Qa;
  std::__cxx11::string::string
            ((string *)&local_28,"x = 3; d(pow(x,5))/dx != 405",(allocator *)&local_fc);
  Kandinsky::assertOrExit(ABS(local_f8 + -405.0) < 0.0001,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  Kandinsky::Expression::~Expression((Expression *)&local_e0);
  Kandinsky::BinaryExpression::~BinaryExpression(&local_a8);
  local_fc = 4;
  Kandinsky::pow<int,_Kandinsky::Variable,_nullptr>
            ((PowerExpression *)&local_a8,&local_fc,&local_c0);
  Kandinsky::BaseExpression::differentiate(&local_80,&local_a8.super_BaseExpression,&local_c0);
  (**(local_80.m_baseExpressionPtr.
      super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     _vptr_BaseExpression)();
  local_f8 = extraout_XMM0_Qa_00;
  std::__cxx11::to_string(&local_e0,88.722839111673);
  std::operator+(&local_48,"x = 3; d(pow(4,x))/dx != ",&local_e0);
  Kandinsky::assertOrExit(ABS(local_f8 + -88.722839111673) < 0.0001,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_e0);
  Kandinsky::Expression::~Expression(&local_80);
  Kandinsky::BinaryExpression::~BinaryExpression(&local_a8);
  (local_c0.m_variableExpressionPtr.
   super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_value =
       0.0;
  local_80._vptr_Expression._0_4_ = 5;
  Kandinsky::pow<Kandinsky::Variable,_int,_nullptr>
            ((PowerExpression *)&local_a8,&local_c0,(int *)&local_80);
  Kandinsky::BaseExpression::differentiate
            ((Expression *)&local_e0,&local_a8.super_BaseExpression,&local_c0);
  (*(code *)**(undefined8 **)local_e0._M_string_length)();
  local_f8 = extraout_XMM0_Qa_01;
  std::__cxx11::string::string
            ((string *)&local_68,"x = 0; d(pow(x,5))/dx != 0",(allocator *)&local_fc);
  Kandinsky::assertOrExit(ABS(local_f8) < 0.0001,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  Kandinsky::Expression::~Expression((Expression *)&local_e0);
  Kandinsky::BinaryExpression::~BinaryExpression(&local_a8);
  Kandinsky::Variable::~Variable(&local_c0);
  return 0;
}

Assistant:

int main (int /*argc*/, char** /*argv*/)
{
    Variable x;
    x.setValue(3);
    assertOrExit(std::abs((pow(x, 5)).differentiate(x).evaluate() - 405) < 1.e-4, "x = 3; d(pow(x,5))/dx != 405");
    assertOrExit(std::abs((pow(4, x)).differentiate(x).evaluate() - 64*std::log(4)) < 1.e-4, "x = 3; d(pow(4,x))/dx != " + std::to_string(64*std::log(4)));
    x.setValue(0);
    assertOrExit(std::abs((pow(x, 5)).differentiate(x).evaluate() - 0) < 1.e-4, "x = 0; d(pow(x,5))/dx != 0");
    return 0;
}